

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

iterator_range<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
 __thiscall
burst::algorithm::
bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
::find_next<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
          (bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
           *this,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 previous_match_begin,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          previous_match_end,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          corpus_end,bitmask_type *hint)

{
  bool bVar1;
  element_type *this_00;
  reference element;
  _Base_bitset<1UL> local_60;
  _Base_bitset<1UL> local_58;
  _Base_bitset<1UL> local_50;
  _Base_bitset<1UL> local_48;
  bitmask_type *local_40;
  bitmask_type *hint_local;
  bitap<wchar_t,_std::bitset<32UL>,_std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
  *this_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  corpus_end_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  previous_match_end_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  previous_match_begin_local;
  
  local_40 = hint;
  hint_local = (bitmask_type *)this;
  this_local = (bitap<wchar_t,_std::bitset<32UL>,_std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
                *)corpus_end._M_current;
  corpus_end_local = previous_match_end;
  previous_match_end_local = previous_match_begin;
  bVar1 = __gnu_cxx::operator!=
                    (&corpus_end_local,
                     (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      *)&this_local);
  if (bVar1) {
    local_58._M_w = (local_40->super__Base_bitset<1UL>)._M_w;
    local_50._M_w =
         (_WordT)bitap<wchar_t,_std::bitset<32UL>,_std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
                 ::bit_shift(local_58._M_w);
    this_00 = std::
              __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    element = __gnu_cxx::
              __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::operator*(&corpus_end_local);
    local_60._M_w =
         (_WordT)algorithm::detail::
                 element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
                 ::operator[](this_00,element);
    local_48._M_w = (_WordT)std::operator&((bitset<32UL> *)&local_50,(bitset<32UL> *)&local_60);
    (local_40->super__Base_bitset<1UL>)._M_w = local_48._M_w;
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&previous_match_end_local);
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&corpus_end_local);
    _previous_match_begin_local =
         (iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::incrementable_traversal_tag>
          )active_search<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
                     (this,previous_match_end_local,corpus_end_local,
                      (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                       )this_local,local_40);
  }
  else {
    _previous_match_begin_local =
         (iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::incrementable_traversal_tag>
          )boost::
           make_iterator_range<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
                     ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                       )this_local,
                      (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                       )this_local);
  }
  return (iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
          )(iterator_range_base<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_boost::iterators::random_access_traversal_tag>
            )_previous_match_begin_local;
}

Assistant:

boost::iterator_range<ForwardIterator>
                find_next
                (
                    ForwardIterator previous_match_begin,
                    ForwardIterator previous_match_end,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                if (previous_match_end != corpus_end)
                {
                    hint = bit_shift(hint) & (*m_bitmask_table)[*previous_match_end];
                    ++previous_match_begin;
                    ++previous_match_end;

                    return
                        active_search(previous_match_begin, previous_match_end, corpus_end, hint);
                }
                else
                {
                    return boost::make_iterator_range(corpus_end, corpus_end);
                }
            }